

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

bool __thiscall
QPDF::pipeForeignStreamData
          (QPDF *this,shared_ptr<QPDF::ForeignStreamData> *foreign,Pipeline *pipeline,
          bool suppress_warnings,bool will_retry)

{
  qpdf_offset_t offset;
  size_t length;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  QPDFObjectHandle local_78;
  QPDFObjGen local_68;
  shared_ptr<InputSource> local_60;
  shared_ptr<QPDF::EncryptionParameters> local_50;
  byte local_3a;
  byte local_39;
  bool will_retry_local;
  Pipeline *pPStack_38;
  bool suppress_warnings_local;
  Pipeline *pipeline_local;
  shared_ptr<QPDF::ForeignStreamData> *foreign_local;
  QPDF *this_local;
  
  local_3a = will_retry;
  local_39 = suppress_warnings;
  pPStack_38 = pipeline;
  pipeline_local = (Pipeline *)foreign;
  foreign_local = (shared_ptr<QPDF::ForeignStreamData> *)this;
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  peVar3 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)peVar2);
  if ((peVar3->encrypted & 1U) != 0) {
    QTC::TC("qpdf","QPDF pipe foreign encrypted stream",0);
  }
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&local_50,&peVar2->encp);
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  std::shared_ptr<InputSource>::shared_ptr(&local_60,&peVar2->file);
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  local_68 = peVar2->foreign_og;
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  offset = peVar2->offset;
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  length = peVar2->length;
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  QPDFObjectHandle::QPDFObjectHandle(&local_78,&peVar2->local_dict);
  peVar2 = std::
           __shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)foreign);
  bVar1 = pipeStreamData(&local_50,&local_60,this,local_68,offset,length,&local_78,
                         (bool)(peVar2->is_root_metadata & 1),pPStack_38,(bool)(local_39 & 1),
                         (bool)(local_3a & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_78);
  std::shared_ptr<InputSource>::~shared_ptr(&local_60);
  std::shared_ptr<QPDF::EncryptionParameters>::~shared_ptr(&local_50);
  return bVar1;
}

Assistant:

bool
QPDF::pipeForeignStreamData(
    std::shared_ptr<ForeignStreamData> foreign,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    if (foreign->encp->encrypted) {
        QTC::TC("qpdf", "QPDF pipe foreign encrypted stream");
    }
    return pipeStreamData(
        foreign->encp,
        foreign->file,
        *this,
        foreign->foreign_og,
        foreign->offset,
        foreign->length,
        foreign->local_dict,
        foreign->is_root_metadata,
        pipeline,
        suppress_warnings,
        will_retry);
}